

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder_exception.cpp
# Opt level: O0

BinderException *
duckdb::BinderException::NoMatchingFunction
          (string *name,vector<duckdb::LogicalType,_true> *arguments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *candidates)

{
  bool bVar1;
  mapped_type *pmVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RCX;
  string *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *candidate;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *__range1;
  string candidate_str;
  string call_str;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  extra_info;
  key_type *in_stack_fffffffffffffce8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcf0;
  allocator *paVar3;
  mapped_type *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  optional_idx error_location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  string *in_stack_fffffffffffffd68;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  string local_230 [39];
  undefined1 local_209 [40];
  allocator local_1e1;
  string local_1e0 [24];
  LogicalType *in_stack_fffffffffffffe38;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  reference local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_f8;
  string local_f0 [56];
  string local_b8 [32];
  optional_idx local_98 [3];
  undefined1 local_79 [89];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_20;
  string *local_10;
  
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffffd08 >> 0x38);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
  error_location.index = (idx_t)in_RDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_79 + 1),"NO_MATCHING_FUNCTION",(allocator *)params);
  optional_idx::optional_idx(local_98);
  Exception::InitializeExtraInfo(in_RDI,error_location);
  ::std::__cxx11::string::~string((string *)(local_79 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_79);
  LogicalType::LogicalType(in_stack_fffffffffffffd10,id);
  Function::CallToString
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  LogicalType::~LogicalType((LogicalType *)0x2f64e2);
  ::std::__cxx11::string::string(local_f0);
  local_f8 = local_20;
  local_100._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffce8);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffce8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcf0,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffce8);
    if (!bVar1) break;
    local_110 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_100);
    ::std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    ::std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
    ::std::__cxx11::string::operator+=(local_f0,local_130);
    ::std::__cxx11::string::~string(local_130);
    ::std::__cxx11::string::~string(local_150);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_100);
  }
  paVar3 = &local_171;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_170,"name",paVar3);
  pmVar2 = ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  ::std::__cxx11::string::operator=((string *)pmVar2,local_10);
  ::std::__cxx11::string::~string(local_170);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_198,"call",&local_199);
  pmVar2 = ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  ::std::__cxx11::string::operator=((string *)pmVar2,local_b8);
  ::std::__cxx11::string::~string(local_198);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
  bVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd00);
  if (!bVar1) {
    paVar3 = &local_1e1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e0,",",paVar3);
    StringUtil::Join(local_20,in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd00 = (string *)local_209;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_209 + 1),"candidates",(allocator *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffcf8 =
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    ::std::__cxx11::string::operator=
              ((string *)in_stack_fffffffffffffcf8,(string *)&stack0xfffffffffffffe40);
    ::std::__cxx11::string::~string((string *)(local_209 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_209);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
    ::std::__cxx11::string::~string(local_1e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  paVar3 = &local_251;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_250,
             "No function matches the given name and argument types \'%s\'. You might need to add explicit type casts.\n\tCandidate functions:\n%s"
             ,paVar3);
  ::std::__cxx11::string::string(local_278,local_b8);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffd68,local_f0);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffd68,params,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             error_location.index);
  BinderException((BinderException *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)paVar3);
  ::std::__cxx11::string::~string(local_230);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  ::std::__cxx11::string::~string(local_278);
  ::std::__cxx11::string::~string(local_250);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
  ::std::__cxx11::string::~string(local_f0);
  ::std::__cxx11::string::~string(local_b8);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x2f6afd);
  return (BinderException *)
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error_location.index;
}

Assistant:

BinderException BinderException::NoMatchingFunction(const string &name, const vector<LogicalType> &arguments,
                                                    const vector<string> &candidates) {
	auto extra_info = Exception::InitializeExtraInfo("NO_MATCHING_FUNCTION", optional_idx());
	// no matching function was found, throw an error
	string call_str = Function::CallToString(name, arguments);
	string candidate_str;
	for (auto &candidate : candidates) {
		candidate_str += "\t" + candidate + "\n";
	}
	extra_info["name"] = name;
	extra_info["call"] = call_str;
	if (!candidates.empty()) {
		extra_info["candidates"] = StringUtil::Join(candidates, ",");
	}
	return BinderException(
	    StringUtil::Format("No function matches the given name and argument types '%s'. You might need to add "
	                       "explicit type casts.\n\tCandidate functions:\n%s",
	                       call_str, candidate_str),
	    extra_info);
}